

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_wait_for_operation__pulse
                    (ma_context *pContext,ma_pa_mainloop *pMainLoop,ma_pa_operation *pOP)

{
  int iVar1;
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4a31,
                  "ma_result ma_wait_for_operation__pulse(ma_context *, ma_pa_mainloop *, ma_pa_operation *)"
                 );
  }
  if (pMainLoop != (ma_pa_mainloop *)0x0) {
    do {
      iVar1 = (*(pContext->field_21).alsa.snd_pcm_hw_params_get_channels_max)(pOP);
      if (iVar1 != 0) {
        return 0;
      }
      iVar1 = (*(pContext->field_21).alsa.snd_pcm_hw_params_any)(pMainLoop,1,0);
    } while (-1 < iVar1);
    return -1;
  }
  __assert_fail("pMainLoop != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x4a32,
                "ma_result ma_wait_for_operation__pulse(ma_context *, ma_pa_mainloop *, ma_pa_operation *)"
               );
}

Assistant:

static ma_result ma_wait_for_operation__pulse(ma_context* pContext, ma_pa_mainloop* pMainLoop, ma_pa_operation* pOP)
{
    MA_ASSERT(pContext != NULL);
    MA_ASSERT(pMainLoop != NULL);
    MA_ASSERT(pOP != NULL);

    while (((ma_pa_operation_get_state_proc)pContext->pulse.pa_operation_get_state)(pOP) == MA_PA_OPERATION_RUNNING) {
        int error = ((ma_pa_mainloop_iterate_proc)pContext->pulse.pa_mainloop_iterate)(pMainLoop, 1, NULL);
        if (error < 0) {
            return ma_result_from_pulse(error);
        }
    }

    return MA_SUCCESS;
}